

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O0

size_t pstore::utf::length(char *str,size_t nbytes)

{
  size_t local_20;
  size_t nbytes_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    local_20 = 0;
  }
  else {
    local_20 = length<char_const*>(str,str + nbytes);
  }
  return local_20;
}

Assistant:

auto length (char const * const str, std::size_t const nbytes) -> std::size_t {
            return str == nullptr ? 0 : length (str, str + nbytes);
        }